

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

result<long,_toml::error_info> *
toml::read_int<long>
          (result<long,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src,
          uint8_t base)

{
  undefined3 in_register_00000009;
  int iVar1;
  source_location *this;
  source_location sStack_1f8;
  source_location local_180;
  source_location local_108;
  source_location local_90;
  
  iVar1 = CONCAT31(in_register_00000009,base);
  this = &sStack_1f8;
  if (iVar1 == 0x10) {
    this = &local_180;
    source_location::source_location(this,src);
    read_hex_int<long>(__return_storage_ptr__,str,this);
  }
  else if (iVar1 == 8) {
    this = &local_108;
    source_location::source_location(this,src);
    read_oct_int<long>(__return_storage_ptr__,str,this);
  }
  else if (iVar1 == 2) {
    this = &local_90;
    source_location::source_location(this,src);
    read_bin_int<long>(__return_storage_ptr__,str,this);
  }
  else {
    source_location::source_location(&sStack_1f8,src);
    read_dec_int<long>(__return_storage_ptr__,str,&sStack_1f8);
  }
  source_location::~source_location(this);
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_int(const std::string& str, const source_location src, const std::uint8_t base)
{
    assert(base == 10 || base == 16 || base == 8 || base == 2);
    switch(base)
    {
        case  2: { return read_bin_int<T>(str, src); }
        case  8: { return read_oct_int<T>(str, src); }
        case 16: { return read_hex_int<T>(str, src); }
        default:
        {
            assert(base == 10);
            return read_dec_int<T>(str, src);
        }
    }
}